

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O2

void __thiscall
xLearn::DMATRIX_TEST_Find_Max_Feat_and_Field_Test::DMATRIX_TEST_Find_Max_Feat_and_Field_Test
          (DMATRIX_TEST_Find_Max_Feat_and_Field_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00158140;
  return;
}

Assistant:

TEST(DMATRIX_TEST, Find_Max_Feat_and_Field) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  EXPECT_EQ(matrix.MaxFeat(), 9);
  EXPECT_EQ(matrix.MaxField(), 9);
}